

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::recoveredgebyflips
          (tetgenmesh *this,point startpt,point endpt,face *sedge,triface *searchtet,int fullsearch)

{
  double dVar1;
  tetrahedron ppdVar2;
  tetrahedron endpt_00;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  double *pdVar5;
  interresult iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  interresult iVar11;
  tetrahedron *pppdVar12;
  ulong uVar13;
  int *piVar14;
  tetrahedron *pppdVar15;
  tetrahedron *pppdVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  int types [2];
  int poss [4];
  flipconstraints fc;
  
  fc.fac[0] = (point)0x0;
  fc.remvert = (point)0x0;
  fc.enqflag = 0;
  fc.chkencflag = 0;
  fc.unflip = 0;
  fc.collectnewtets = 0;
  fc.collectencsegflag = 0;
  fc.remove_ndelaunay_edge = 0;
  fc.bak_tetprism_vol._0_4_ = 0;
  fc.bak_tetprism_vol._4_4_ = 0;
  fc.tetprism_vol_sum._0_4_ = 0;
  fc._36_8_ = 0;
  fc.cosdihed_in = 0.0;
  fc.cosdihed_out = 0.0;
  fc.checkflipeligibility = 1;
  fc.seg[0] = startpt;
  fc.seg[1] = endpt;
LAB_00135b63:
  do {
    dVar1 = startpt[this->point2simindex];
    searchtet->ver = SUB84(dVar1,0) & 0xf;
    pppdVar12 = (tetrahedron *)((ulong)dVar1 & 0xfffffffffffffff0);
    searchtet->tet = pppdVar12;
    if (pppdVar12[4] == (tetrahedron)startpt) {
      iVar7 = 0xb;
    }
    else if (pppdVar12[5] == (tetrahedron)startpt) {
      iVar7 = 3;
    }
    else {
      iVar7 = 0;
      if (pppdVar12[6] == (tetrahedron)startpt) {
        iVar7 = 7;
      }
    }
    searchtet->ver = iVar7;
    iVar6 = finddirection(this,searchtet,endpt);
    if (iVar6 == ACROSSVERT) {
      if (searchtet->tet[destpivot[searchtet->ver]] == (tetrahedron)endpt) {
        return 1;
      }
      if (sedge == (face *)0x0) {
        return 0;
      }
      iVar6 = ACROSSVERT;
      goto LAB_001362c0;
    }
    uVar17 = enextesymtbl[searchtet->ver];
    searchtet->ver = uVar17;
    if (iVar6 == ACROSSFACE) {
      if (((this->checksubfaceflag != 0) && (searchtet->tet[9] != (tetrahedron)0x0)) &&
         (searchtet->tet[9][uVar17 & 3] != (double *)0x0)) {
        if (sedge == (face *)0x0) {
          return 0;
        }
        iVar6 = ACROSSFACE;
        goto LAB_001362c0;
      }
      iVar7 = removefacebyflips(this,searchtet,&fc);
      if (iVar7 == 0) goto LAB_00135c63;
    }
    else {
      if (((this->checksubsegflag != 0) && (searchtet->tet[8] != (tetrahedron)0x0)) &&
         (searchtet->tet[8][ver2edge[(int)uVar17]] != (double *)0x0)) {
        if (sedge != (face *)0x0) {
          iVar6 = ACROSSEDGE;
LAB_001362c0:
          report_selfint_edge(this,startpt,endpt,sedge,searchtet,iVar6);
        }
        return 0;
      }
      iVar7 = removeedgebyflips(this,searchtet,&fc);
      if (iVar7 != 2) {
LAB_00135c63:
        if (fullsearch == 0) {
          return 0;
        }
        dVar1 = startpt[this->point2simindex];
        searchtet->ver = SUB84(dVar1,0) & 0xf;
        pppdVar12 = (tetrahedron *)((ulong)dVar1 & 0xfffffffffffffff0);
        searchtet->tet = pppdVar12;
        if (pppdVar12[4] == (tetrahedron)startpt) {
          iVar7 = 0xb;
        }
        else if (pppdVar12[5] == (tetrahedron)startpt) {
          iVar7 = 3;
        }
        else {
          iVar7 = 0;
          if (pppdVar12[6] == (tetrahedron)startpt) {
            iVar7 = 7;
          }
        }
        searchtet->ver = iVar7;
        iVar6 = finddirection(this,searchtet,endpt);
        searchtet->ver = enextesymtbl[searchtet->ver];
LAB_00135cd3:
        uVar17 = searchtet->ver;
        ppdVar2 = searchtet->tet[uVar17 & 3];
        uVar8 = (uint)ppdVar2 & 0xf;
        searchtet->ver = uVar8;
        pppdVar12 = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
        searchtet->tet = pppdVar12;
        uVar17 = fsymtbl[(int)uVar17][uVar8];
        searchtet->ver = uVar17;
        if (iVar6 != ACROSSFACE) {
          if (iVar6 == ACROSSEDGE) {
            do {
              iVar7 = 0;
              do {
                piVar14 = eprevesymtbl;
                if (iVar7 == 0) {
                  piVar14 = enextesymtbl;
                }
                uVar18 = (ulong)piVar14[searchtet->ver];
                pppdVar12 = searchtet->tet;
                iVar9 = tri_edge_test(this,(point)pppdVar12[orgpivot[uVar18]],
                                      (point)pppdVar12[destpivot[uVar18]],
                                      (point)pppdVar12[apexpivot[uVar18]],startpt,endpt,
                                      (point)pppdVar12[oppopivot[uVar18]],1,types,poss);
                iVar10 = poss[0];
                iVar6 = types[0];
                if (iVar9 != 0) break;
                bVar19 = iVar7 == 0;
                iVar7 = iVar7 + 1;
                iVar10 = 0;
                iVar6 = DISJOINT;
              } while (bVar19);
              if (iVar6 != DISJOINT) goto LAB_00135eb4;
              iVar7 = searchtet->ver;
              ppdVar2 = searchtet->tet[facepivot1[iVar7]];
              uVar17 = (uint)ppdVar2 & 0xf;
              searchtet->ver = uVar17;
              searchtet->tet = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
              searchtet->ver = facepivot2[iVar7][uVar17];
            } while( true );
          }
LAB_001361a7:
          puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
          puts("  the message above, your input data set, and the exact");
          puts("  command line you used to run this program, thank you.");
          exit(2);
        }
        iVar7 = 1;
        do {
          uVar8 = (uVar17 & 3) + iVar7 & 3;
          uVar18 = (ulong)uVar8;
          uVar13 = (ulong)(uVar8 * 4);
          iVar9 = tri_edge_test(this,(point)pppdVar12[*(int *)((long)orgpivot + uVar13)],
                                (point)pppdVar12[*(int *)((long)destpivot + uVar13)],
                                (point)pppdVar12[*(int *)((long)apexpivot + uVar13)],startpt,endpt,
                                (point)pppdVar12[*(int *)((long)oppopivot + uVar13)],1,types,poss);
          iVar10 = poss[0];
          iVar6 = types[0];
          if (iVar9 != 0) goto LAB_00135ea9;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 4);
        iVar10 = 0;
        iVar6 = DISJOINT;
LAB_00135ea9:
        if (iVar6 == DISJOINT) goto LAB_001361a7;
LAB_00135eb4:
        uVar17 = (uint)uVar18;
        if (0 < iVar10) {
          do {
            uVar17 = enexttbl[(int)uVar18];
            uVar18 = (ulong)uVar17;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        if (iVar6 == SHAREVERT) {
          if (pppdVar12[orgpivot[(int)uVar17]] == (tetrahedron)endpt) {
            return 0;
          }
          goto LAB_001361a7;
        }
        searchtet->tet = pppdVar12;
        searchtet->ver = uVar17;
        ppdVar2 = pppdVar12[orgpivot[(int)uVar17]];
        endpt_00 = pppdVar12[destpivot[(int)uVar17]];
        ppdVar3 = pppdVar12[apexpivot[(int)uVar17]];
        ppdVar4 = pppdVar12[oppopivot[(int)uVar17]];
        if (iVar6 == ACROSSEDGE) {
          if (((this->checksubsegflag != 0) && (pppdVar12[8] != (tetrahedron)0x0)) &&
             (pppdVar12[8][ver2edge[(int)uVar17]] != (double *)0x0)) {
            if (sedge == (face *)0x0) {
              return 0;
            }
            iVar6 = ACROSSEDGE;
LAB_00136259:
            report_selfint_edge(this,startpt,endpt,sedge,searchtet,iVar6);
            return 0;
          }
          iVar7 = removeedgebyflips(this,searchtet,&fc);
          if (iVar7 == 2) goto LAB_00135b63;
        }
        else {
          if (iVar6 != ACROSSFACE) {
            if ((iVar6 == ACROSSVERT) && (sedge == (face *)0x0)) {
              return 0;
            }
            goto LAB_001361a7;
          }
          if (((this->checksubfaceflag != 0) && (pppdVar12[9] != (tetrahedron)0x0)) &&
             (pppdVar12[9][uVar17 & 3] != (double *)0x0)) {
            if (sedge == (face *)0x0) {
              return 0;
            }
            iVar6 = ACROSSFACE;
            goto LAB_00136259;
          }
          iVar7 = removefacebyflips(this,searchtet,&fc);
          if (iVar7 != 0) goto LAB_00135b63;
        }
        pppdVar12 = searchtet->tet;
        if (((pppdVar12 == (tetrahedron *)0x0) ||
            (iVar7 = searchtet->ver, pppdVar12[orgpivot[iVar7]] != ppdVar2)) ||
           ((pppdVar12[destpivot[iVar7]] != endpt_00 ||
            ((pppdVar12[apexpivot[iVar7]] != ppdVar3 || (pppdVar12[oppopivot[iVar7]] != ppdVar4)))))
           ) {
          pdVar5 = ppdVar2[this->point2simindex];
          searchtet->ver = (uint)pdVar5 & 0xf;
          pppdVar12 = (tetrahedron *)((ulong)pdVar5 & 0xfffffffffffffff0);
          searchtet->tet = pppdVar12;
          if (pppdVar12[4] == ppdVar2) {
            iVar7 = 0xb;
          }
          else if (pppdVar12[5] == ppdVar2) {
            iVar7 = 3;
          }
          else {
            iVar7 = 0;
            if (pppdVar12[6] == ppdVar2) {
              iVar7 = 7;
            }
          }
          searchtet->ver = iVar7;
          iVar11 = finddirection(this,searchtet,(point)endpt_00);
          if (iVar11 == ACROSSVERT) {
            pppdVar12 = searchtet->tet;
            uVar18 = (ulong)searchtet->ver;
            pppdVar15 = pppdVar12;
            if (pppdVar12[destpivot[uVar18]] != endpt_00) goto LAB_0013607e;
            do {
              iVar7 = (int)uVar18;
              if (pppdVar15[apexpivot[iVar7]] == ppdVar3) {
                searchtet->tet = pppdVar15;
                searchtet->ver = iVar7;
                goto LAB_001360f1;
              }
              pppdVar16 = (tetrahedron *)((ulong)pppdVar15[facepivot1[iVar7]] & 0xfffffffffffffff0);
              uVar18 = (ulong)(uint)facepivot2[iVar7][(uint)pppdVar15[facepivot1[iVar7]] & 0xf];
              pppdVar15 = pppdVar16;
            } while (pppdVar12 != pppdVar16);
            searchtet->tet = (tetrahedron *)0x0;
LAB_001360f1:
            pppdVar12 = searchtet->tet;
            if (pppdVar12 != (tetrahedron *)0x0) {
              uVar17 = searchtet->ver;
              if (pppdVar12[oppopivot[(int)uVar17]] != ppdVar4) {
                ppdVar2 = pppdVar12[uVar17 & 3];
                uVar8 = (uint)ppdVar2 & 0xf;
                searchtet->ver = uVar8;
                pppdVar12 = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
                searchtet->tet = pppdVar12;
                iVar7 = fsymtbl[(int)uVar17][uVar8];
                searchtet->ver = iVar7;
                if (pppdVar12[oppopivot[iVar7]] != ppdVar4) {
                  searchtet->tet = (tetrahedron *)0x0;
                  return 0;
                }
              }
            }
          }
          else {
LAB_0013607e:
            searchtet->tet = (tetrahedron *)0x0;
          }
          if (searchtet->tet == (tetrahedron *)0x0) {
            return 0;
          }
        }
        goto LAB_00135cd3;
      }
    }
  } while( true );
}

Assistant:

int tetgenmesh::recoveredgebyflips(point startpt, point endpt, face *sedge,
                                   triface* searchtet, int fullsearch)
{
  flipconstraints fc;
  enum interresult dir;

  fc.seg[0] = startpt;
  fc.seg[1] = endpt;
  fc.checkflipeligibility = 1;

  // The mainloop of the edge reocvery.
  while (1) { // Loop I

    // Search the edge from 'startpt'.
    point2tetorg(startpt, *searchtet);
    dir = finddirection(searchtet, endpt);
    if (dir == ACROSSVERT) {
      if (dest(*searchtet) == endpt) {
        return 1; // Edge is recovered.
      } else {
        if (sedge) {
          return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
        } else {
          return 0;
        }
      }
    }

    // The edge is missing. 

    // Try to remove the first intersecting face/edge.
    enextesymself(*searchtet); // Go to the opposite face.
    if (dir == ACROSSFACE) {
      if (checksubfaceflag) {
        if (issubface(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a subface.
          }
        }
      }
      // Try to flip a crossing face.
      if (removefacebyflips(searchtet, &fc)) {
        continue;
      }
    } else if (dir == ACROSSEDGE) {
      if (checksubsegflag) {
        if (issubseg(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a segment.
          }
        }
      }
      // Try to flip an intersecting edge.
      if (removeedgebyflips(searchtet, &fc) == 2) {
        continue;
      }
    }

    // The edge is missing.

    if (fullsearch) {
      // Try to flip one of the faces/edges which intersects the edge.
      triface neightet, spintet;
      point pa, pb, pc, pd;
      badface bakface;
      enum interresult dir1;
      int types[2], poss[4], pos = 0;
      int success = 0;
      int t1ver; 
      int i, j;

      // Loop through the sequence of intersecting faces/edges from
      //   'startpt' to 'endpt'.
      point2tetorg(startpt, *searchtet);
      dir = finddirection(searchtet, endpt);

      // Go to the face/edge intersecting the searching edge.
      enextesymself(*searchtet); // Go to the opposite face.
      // This face/edge has been tried in previous step.

      while (1) { // Loop I-I

        // Find the next intersecting face/edge.
        fsymself(*searchtet);
        if (dir == ACROSSFACE) {
          neightet = *searchtet;
          j = (neightet.ver & 3); // j is the current face number.
          for (i = j + 1; i < j + 4; i++) {
            neightet.ver = (i % 4);
            pa = org(neightet);
            pb = dest(neightet);
            pc = apex(neightet);
            pd = oppo(neightet); // The above point.
            if (tri_edge_test(pa,pb,pc,startpt,endpt, pd, 1, types, poss)) {
              dir = (enum interresult) types[0];
              pos = poss[0];
              break;
            } else {
              dir = DISJOINT;
              pos = 0;
            }
          } // i
          // There must be an intersection face/edge.
          if (dir == DISJOINT) {
            terminatetetgen(this, 2);
          }
        } else if (dir == ACROSSEDGE) {
          while (1) { // Loop I-I-I
            // Check the two opposite faces (of the edge) in 'searchtet'.  
            for (i = 0; i < 2; i++) {
              if (i == 0) {
                enextesym(*searchtet, neightet);
              } else {
                eprevesym(*searchtet, neightet);
              }
              pa = org(neightet);
              pb = dest(neightet);
              pc = apex(neightet);
              pd = oppo(neightet); // The above point.
              if (tri_edge_test(pa,pb,pc,startpt,endpt,pd,1, types, poss)) {
                dir = (enum interresult) types[0];
                pos = poss[0];
                break; // for loop
              } else {
                dir = DISJOINT;
                pos = 0;
              }
            } // i
            if (dir != DISJOINT) {
              // Find an intersection face/edge.
              break;  // Loop I-I-I
            }
            // No intersection. Rotate to the next tet at the edge.
            fnextself(*searchtet);
          } // while (1) // Loop I-I-I
        } else {
          terminatetetgen(this, 2); // Report a bug
        }

        // Adjust to the intersecting edge/vertex.
        for (i = 0; i < pos; i++) {
          enextself(neightet);
        }

        if (dir == SHAREVERT) {
          // Check if we have reached the 'endpt'.
          pd = org(neightet);
          if (pd == endpt) {
            // Failed to recover the edge.
            break; // Loop I-I
          } else {
            terminatetetgen(this, 2); // Report a bug
          }
        }

        // The next to be flipped face/edge.
        *searchtet = neightet;

        // Bakup this face (tetrahedron).
        bakface.forg = org(*searchtet);
        bakface.fdest = dest(*searchtet);
        bakface.fapex = apex(*searchtet);
        bakface.foppo = oppo(*searchtet);

        // Try to flip this intersecting face/edge.
        if (dir == ACROSSFACE) {
          if (checksubfaceflag) {
            if (issubface(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a subface.
              }
            }
          }
          if (removefacebyflips(searchtet, &fc)) {
            success = 1;
            break; // Loop I-I 
          }
        } else if (dir == ACROSSEDGE) {
          if (checksubsegflag) {
            if (issubseg(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a segment.
              }
            }
          }
          if (removeedgebyflips(searchtet, &fc) == 2) {
            success = 1;
            break; // Loop I-I
          }
        } else if (dir == ACROSSVERT) {
          if (sedge) {
            //return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
            terminatetetgen(this, 2);
          } else {
            return 0;
          }
        } else {
          terminatetetgen(this, 2); 
        }

        // The face/edge is not flipped.
        if ((searchtet->tet == NULL) ||
            (org(*searchtet) != bakface.forg) ||
            (dest(*searchtet) != bakface.fdest) ||
            (apex(*searchtet) != bakface.fapex) ||
            (oppo(*searchtet) != bakface.foppo)) {
          // 'searchtet' was flipped. We must restore it.
          point2tetorg(bakface.forg, *searchtet);
          dir1 = finddirection(searchtet, bakface.fdest);
          if (dir1 == ACROSSVERT) {
            if (dest(*searchtet) == bakface.fdest) {
              spintet = *searchtet;
              while (1) {
                if (apex(spintet) == bakface.fapex) {
                  // Found the face.
                  *searchtet = spintet;
                  break;
                }
                fnextself(spintet);
                if (spintet.tet == searchtet->tet) {
                  searchtet->tet = NULL;
                  break; // Not find.
                }
	          } // while (1)
              if (searchtet->tet != NULL) {
                if (oppo(*searchtet) != bakface.foppo) {
                  fsymself(*searchtet);
                  if (oppo(*searchtet) != bakface.foppo) {
                    // The original (intersecting) tet has been flipped.
                    searchtet->tet = NULL;
                    break; // Not find.
                  }
                }
              }
            } else {
              searchtet->tet = NULL; // Not find.
            }
          } else {
            searchtet->tet = NULL; // Not find.
          }
          if (searchtet->tet == NULL) {
            success = 0; // This face/edge has been destroyed.
            break; // Loop I-I 
          }
        }
      } // while (1) // Loop I-I

      if (success) {
        // One of intersecting faces/edges is flipped.
        continue;
      }

    } // if (fullsearch)

    // The edge is missing.
    break; // Loop I

  } // while (1) // Loop I

  return 0;
}